

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

iterator __thiscall
fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char *value)

{
  format_specs *pfVar1;
  iterator iVar2;
  size_t in_RCX;
  void *__buf;
  long in_RSI;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_RDI;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffffe0;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_fffffffffffffff8;
  
  if (in_RSI == 0) {
    pfVar1 = internal::
             arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
             ::spec(in_RDI);
    if ((pfVar1->super_core_format_specs).type == 'p') {
      write_null_pointer(in_stack_ffffffffffffffe0,(char)((ulong)in_RDI >> 0x38));
    }
    else {
      internal::
      arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                (in_RDI,0x262bd6,__buf,in_RCX);
    }
  }
  else {
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    operator()(in_stack_fffffffffffffff8,(char_type *)in_RDI);
  }
  iVar2 = internal::
          arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
          out(in_RDI);
  return (iterator)iVar2.container;
}

Assistant:

iterator operator()(const char *value) {
    if (value)
      base::operator()(value);
    else if (this->spec()->type == 'p')
      write_null_pointer(char_type());
    else
      this->write("(null)");
    return this->out();
  }